

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaCom.c
# Opt level: O3

int Abc_CommandWritePla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Pla_Man_t *p;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  p = (Pla_Man_t *)pAbc->pAbcPla;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (p == (Pla_Man_t *)0x0) {
      Abc_Print(1,"Abc_CommandWritePla(): There is no current design.\n");
      return 0;
    }
    if (globalUtilOptind == argc) {
      pcVar3 = Extra_FileNameGenericAppend(p->pName,"_out.v");
    }
    else {
      if (globalUtilOptind + 1 != argc) {
        puts("Output file name should be given on the command line.");
        return 0;
      }
      pcVar3 = argv[globalUtilOptind];
    }
    Pla_WritePla(p,pcVar3);
    return 0;
  }
  Abc_Print(-2,"usage: |write [-vh]\n");
  Abc_Print(-2,"\t         writes the SOP into a PLA file\n");
  pcVar3 = "yes";
  if (!bVar1) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandWritePla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Pla_Man_t * p = Pla_AbcGetMan(pAbc);
    char * pFileName = NULL;
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Abc_CommandWritePla(): There is no current design.\n" );
        return 0;
    }
    if ( argc == globalUtilOptind )
        pFileName = Extra_FileNameGenericAppend( p->pName, "_out.v" );
    else if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    Pla_WritePla( p, pFileName );
    return 0;
usage:
    Abc_Print( -2, "usage: |write [-vh]\n" );
    Abc_Print( -2, "\t         writes the SOP into a PLA file\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",        fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}